

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.cpp
# Opt level: O0

void luaO_chunkid(char *out,char *source,size_t bufflen)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *nl;
  size_t l;
  size_t bufflen_local;
  char *source_local;
  char *out_local;
  
  nl = (char *)strlen(source);
  if (*source == '=') {
    if (bufflen < nl) {
      memcpy(out,source + 1,bufflen - 1);
      out[bufflen - 1] = '\0';
    }
    else {
      memcpy(out,source + 1,(size_t)nl);
    }
  }
  else if (*source == '@') {
    if (bufflen < nl) {
      out[0] = '.';
      out[1] = '.';
      out[2] = '.';
      memcpy(out + 3,source + 1 + (long)nl + -(bufflen - 3),bufflen - 3);
    }
    else {
      memcpy(out,source + 1,(size_t)nl);
    }
  }
  else {
    pcVar1 = strchr(source,10);
    builtin_strncpy(out,"[string \"",9);
    pcVar2 = out + 9;
    pcVar3 = (char *)(bufflen - 0xf);
    if ((nl < pcVar3) && (pcVar1 == (char *)0x0)) {
      memcpy(pcVar2,source,(size_t)nl);
      source_local = nl + (long)pcVar2;
    }
    else {
      if (pcVar1 != (char *)0x0) {
        nl = pcVar1 + -(long)source;
      }
      if (pcVar3 < nl) {
        nl = pcVar3;
      }
      memcpy(pcVar2,source,(size_t)nl);
      pcVar2 = nl + (long)pcVar2;
      pcVar2[0] = '.';
      pcVar2[1] = '.';
      pcVar2[2] = '.';
      source_local = pcVar2 + 3;
    }
    source_local[0] = '\"';
    source_local[1] = ']';
    source_local[2] = '\0';
  }
  return;
}

Assistant:

void luaO_chunkid (char *out, const char *source, size_t bufflen) {
  size_t l = strlen(source);
  if (*source == '=') {  /* 'literal' source */
    if (l <= bufflen)  /* small enough? */
      memcpy(out, source + 1, l * sizeof(char));
    else {  /* truncate it */
      addstr(out, source + 1, bufflen - 1);
      *out = '\0';
    }
  }
  else if (*source == '@') {  /* file name */
    if (l <= bufflen)  /* small enough? */
      memcpy(out, source + 1, l * sizeof(char));
    else {  /* add '...' before rest of name */
      addstr(out, RETS, LL(RETS));
      bufflen -= LL(RETS);
      memcpy(out, source + 1 + l - bufflen, bufflen * sizeof(char));
    }
  }
  else {  /* string; format as [string "source"] */
    const char *nl = strchr(source, '\n');  /* find first new line (if any) */
    addstr(out, PRE, LL(PRE));  /* add prefix */
    bufflen -= LL(PRE RETS POS) + 1;  /* save space for prefix+suffix+'\0' */
    if (l < bufflen && nl == NULL) {  /* small one-line source? */
      addstr(out, source, l);  /* keep it */
    }
    else {
      if (nl != NULL) l = nl - source;  /* stop at first newline */
      if (l > bufflen) l = bufflen;
      addstr(out, source, l);
      addstr(out, RETS, LL(RETS));
    }
    memcpy(out, POS, (LL(POS) + 1) * sizeof(char));
  }
}